

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

char * fmt::v10::detail::parse_dynamic_spec<char>
                 (char *begin,char *end,int *value,arg_ref<char> *ref,
                 basic_format_parse_context<char> *ctx)

{
  char cVar1;
  int iVar2;
  dynamic_spec_id_handler<char> *pdVar3;
  dynamic_spec_id_handler<char> *in_RCX;
  char **in_RDX;
  dynamic_spec_id_handler<char> *in_RSI;
  dynamic_spec_id_handler<char> *in_RDI;
  undefined8 in_R8;
  bool bVar4;
  dynamic_spec_id_handler<char> handler;
  int val;
  char c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined3 in_stack_ffffffffffffffa4;
  undefined4 uVar5;
  dynamic_spec_id_handler<char> *handler_00;
  char *in_stack_ffffffffffffffd0;
  undefined6 in_stack_ffffffffffffffd8;
  
  iVar2 = (int)((ulong)in_R8 >> 0x20);
  uVar5 = CONCAT13(in_RDI != in_RSI,in_stack_ffffffffffffffa4);
  ignore_unused<bool,char[1]>((bool *)&stack0xffffffffffffffa7,(char (*) [1])0x364eee);
  if ((*(char *)&in_RDI->ctx < '0') || ('9' < *(char *)&in_RDI->ctx)) {
    if (*(char *)&in_RDI->ctx == '{') {
      pdVar3 = (dynamic_spec_id_handler<char> *)((long)&in_RDI->ctx + 1);
      if (pdVar3 != in_RSI) {
        bVar4 = pdVar3 != in_RSI;
        handler_00 = pdVar3;
        ignore_unused<bool,char[1]>((bool *)&stack0xffffffffffffffdf,(char (*) [1])0x364eee);
        cVar1 = *(char *)&pdVar3->ctx;
        if ((cVar1 == '}') || (cVar1 == ':')) {
          dynamic_spec_id_handler<char>::on_auto(in_RCX);
        }
        else {
          pdVar3 = (dynamic_spec_id_handler<char> *)
                   do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                             ((char *)CONCAT17(bVar4,CONCAT16(cVar1,in_stack_ffffffffffffffd8)),
                              in_stack_ffffffffffffffd0,handler_00);
        }
      }
      if ((pdVar3 == in_RSI) || (*(char *)&pdVar3->ctx != '}')) {
        throw_format_error((char *)CONCAT44(uVar5,in_stack_ffffffffffffffa0));
      }
      in_RDI = (dynamic_spec_id_handler<char> *)((long)&pdVar3->ctx + 1);
    }
  }
  else {
    iVar2 = parse_nonnegative_int<char>(in_RDX,(char *)in_RCX,iVar2);
    if (iVar2 == -1) {
      throw_format_error((char *)CONCAT44(uVar5,0xffffffff));
    }
    *(int *)in_RDX = iVar2;
  }
  return (char *)in_RDI;
}

Assistant:

FMT_CONSTEXPR auto parse_dynamic_spec(const Char* begin, const Char* end,
                                      int& value, arg_ref<Char>& ref,
                                      basic_format_parse_context<Char>& ctx)
    -> const Char* {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    int val = parse_nonnegative_int(begin, end, -1);
    if (val != -1)
      value = val;
    else
      throw_format_error("number is too big");
  } else if (*begin == '{') {
    ++begin;
    auto handler = dynamic_spec_id_handler<Char>{ctx, ref};
    if (begin != end) begin = parse_arg_id(begin, end, handler);
    if (begin != end && *begin == '}') return ++begin;
    throw_format_error("invalid format string");
  }
  return begin;
}